

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

void copy_with_crc(z_streamp strm,Bytef *dst,long size)

{
  uLong uVar1;
  
  memcpy(dst,strm->next_in,size);
  uVar1 = crc32_z(strm->adler,dst,size & 0xffffffff);
  strm->adler = uVar1;
  return;
}

Assistant:

ZLIB_INTERNAL void copy_with_crc(z_streamp strm, Bytef *dst, long size)
{
#ifdef CRC32_SIMD_SSE42_PCLMUL
    if (x86_cpu_enable_simd) {
        crc_fold_copy(strm->state, dst, strm->next_in, size);
        return;
    }
#endif
    zmemcpy(dst, strm->next_in, size);
    strm->adler = crc32(strm->adler, dst, size);
}